

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O3

string * __thiscall
libcellml::Analyser::AnalyserImpl::expression_abi_cxx11_
          (string *__return_storage_ptr__,AnalyserImpl *this,AnalyserEquationAstPtr *ast,
          bool includeHierarchy)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  long *plVar3;
  undefined8 *puVar4;
  undefined7 in_register_00000009;
  AnalyserEquationAstImpl *pAVar5;
  size_type *psVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *generatorProfile;
  size_type *psVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  AnalyserEquationAstPtr equationAstParent;
  AnalyserEquationAstPtr equationAst;
  AnalyserEquationAst local_148;
  undefined8 uStack_140;
  undefined1 local_138 [72];
  element_type *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_d0 [2];
  string *local_c0;
  AnalyserEquationAstPtr local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  string local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  AnalyserImpl *local_40;
  GeneratorProfilePtr *local_38;
  
  local_38 = &this->mGeneratorProfile;
  Generator::equationCode_abi_cxx11_
            ((string *)(local_138 + 0x10),(Generator *)ast,(AnalyserEquationAstPtr *)local_38,
             (GeneratorProfilePtr *)CONCAT71(in_register_00000009,includeHierarchy));
  plVar3 = (long *)std::__cxx11::string::replace((ulong)(local_138 + 0x10),0,(char *)0x0,0x2a80f6);
  pAVar5 = (AnalyserEquationAstImpl *)(plVar3 + 2);
  if ((AnalyserEquationAstImpl *)*plVar3 == pAVar5) {
    local_138._0_8_ = *(undefined8 *)pAVar5;
    local_138._8_8_ = plVar3[3];
    local_148.mPimpl = (AnalyserEquationAstImpl *)local_138;
  }
  else {
    local_138._0_8_ = *(undefined8 *)pAVar5;
    local_148.mPimpl = (AnalyserEquationAstImpl *)*plVar3;
  }
  uStack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
  *plVar3 = (long)pAVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_148);
  local_a8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a8;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    lVar2 = plVar3[3];
    local_a8->_M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_148.mPimpl != (AnalyserEquationAstImpl *)local_138) {
    operator_delete(local_148.mPimpl,local_138._0_8_ + 1);
  }
  psVar6 = (size_type *)(local_138 + 0x20);
  if ((size_type *)local_138._16_8_ != psVar6) {
    operator_delete((void *)local_138._16_8_,local_138._32_8_ + 1);
  }
  if (includeHierarchy) {
    local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ast->super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (ast->super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_b8.
              super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_b8.
              super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_c0 = __return_storage_ptr__;
    local_40 = this;
    AnalyserEquationAst::parent((AnalyserEquationAst *)(local_138 + 0x30));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._48_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      AnalyserEquationAst::parent((AnalyserEquationAst *)&local_d8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._48_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        do {
          local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_138._48_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_b8.
                      super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 0x38))
          ;
          local_138._48_8_ = local_d8._M_pi;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 0x38),a_Stack_d0);
          uVar10 = 0;
          uVar11 = 0;
          uVar12 = 0;
          uVar13 = 0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._48_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            AnalyserEquationAst::parent(&local_148);
            uVar10 = local_148.mPimpl._0_4_;
            uVar11 = local_148.mPimpl._4_4_;
            uVar12 = (undefined4)uStack_140;
            uVar13 = uStack_140._4_4_;
          }
          this_00._M_pi = a_Stack_d0[0]._M_pi;
          local_148.mPimpl = (AnalyserEquationAstImpl *)0x0;
          uStack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_d8._M_pi._4_4_ = uVar11;
          local_d8._M_pi._0_4_ = uVar10;
          a_Stack_d0[0]._M_pi._4_4_ = uVar13;
          a_Stack_d0[0]._M_pi._0_4_ = uVar12;
          if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
             uStack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_140);
          }
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_60," in","");
          plVar3 = (long *)std::__cxx11::string::append((char *)local_60);
          plVar7 = plVar3 + 2;
          if ((long *)*plVar3 == plVar7) {
            local_70 = *plVar7;
            lStack_68 = plVar3[3];
            local_80 = &local_70;
          }
          else {
            local_70 = *plVar7;
            local_80 = (long *)*plVar3;
          }
          local_78 = plVar3[1];
          *plVar3 = (long)plVar7;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
          generatorProfile =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 == generatorProfile) {
            local_e8._M_allocated_capacity = generatorProfile->_M_allocated_capacity;
            local_e8._8_8_ = plVar3[3];
            local_138._64_8_ = &local_e8;
          }
          else {
            local_e8._M_allocated_capacity = generatorProfile->_M_allocated_capacity;
            local_138._64_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar3;
          }
          local_f0 = (element_type *)plVar3[1];
          *plVar3 = (long)generatorProfile;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          Generator::equationCode_abi_cxx11_
                    (&local_a0,(Generator *)&local_b8,(AnalyserEquationAstPtr *)local_38,
                     (GeneratorProfilePtr *)generatorProfile);
          uVar9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._64_8_ != &local_e8) {
            uVar9 = local_e8._M_allocated_capacity;
          }
          p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_f0->mPimpl + local_a0._M_string_length);
          if ((ulong)uVar9 < p_Var1) {
            uVar9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              uVar9 = local_a0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar9 < p_Var1) goto LAB_001b5efa;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,local_138._64_8_);
          }
          else {
LAB_001b5efa:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               (local_138 + 0x40,(ulong)local_a0._M_dataplus._M_p);
          }
          psVar8 = puVar4 + 2;
          if ((size_type *)*puVar4 == psVar8) {
            local_138._32_8_ = *psVar8;
            local_138._40_8_ = puVar4[3];
            local_138._16_8_ = psVar6;
          }
          else {
            local_138._32_8_ = *psVar8;
            local_138._16_8_ = (size_type *)*puVar4;
          }
          local_138._24_8_ = puVar4[1];
          *puVar4 = psVar8;
          puVar4[1] = 0;
          *(undefined1 *)psVar8 = 0;
          plVar3 = (long *)std::__cxx11::string::append(local_138 + 0x10);
          pAVar5 = (AnalyserEquationAstImpl *)(plVar3 + 2);
          if ((AnalyserEquationAstImpl *)*plVar3 == pAVar5) {
            local_138._0_8_ = *(undefined8 *)pAVar5;
            local_138._8_8_ = plVar3[3];
            local_148.mPimpl = (AnalyserEquationAstImpl *)local_138;
          }
          else {
            local_138._0_8_ = *(undefined8 *)pAVar5;
            local_148.mPimpl = (AnalyserEquationAstImpl *)*plVar3;
          }
          uStack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
          *plVar3 = (long)pAVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_148.mPimpl);
          if (local_148.mPimpl != (AnalyserEquationAstImpl *)local_138) {
            operator_delete(local_148.mPimpl,local_138._0_8_ + 1);
          }
          if ((size_type *)local_138._16_8_ != psVar6) {
            operator_delete((void *)local_138._16_8_,local_138._32_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,
                            (ulong)(local_a0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._64_8_ != &local_e8) {
            operator_delete((void *)local_138._64_8_,(ulong)(local_e8._M_allocated_capacity + 1));
          }
          if (local_80 != &local_70) {
            operator_delete(local_80,local_70 + 1);
          }
          if (local_60[0] != local_50) {
            operator_delete(local_60[0],local_50[0] + 1);
          }
        } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._48_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
      }
    }
    componentName_abi_cxx11_((string *)(local_138 + 0x40),local_40,&local_b8);
    __return_storage_ptr__ = local_c0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)(local_138 + 0x40),0,(char *)0x0,0x28f5b6);
    psVar8 = puVar4 + 2;
    if ((size_type *)*puVar4 == psVar8) {
      local_138._32_8_ = *psVar8;
      local_138._40_8_ = puVar4[3];
      local_138._16_8_ = psVar6;
    }
    else {
      local_138._32_8_ = *psVar8;
      local_138._16_8_ = (size_type *)*puVar4;
    }
    local_138._24_8_ = puVar4[1];
    *puVar4 = psVar8;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(local_138 + 0x10);
    pAVar5 = (AnalyserEquationAstImpl *)(plVar3 + 2);
    if ((AnalyserEquationAstImpl *)*plVar3 == pAVar5) {
      local_138._0_8_ = *(undefined8 *)pAVar5;
      local_138._8_8_ = plVar3[3];
      local_148.mPimpl = (AnalyserEquationAstImpl *)local_138;
    }
    else {
      local_138._0_8_ = *(undefined8 *)pAVar5;
      local_148.mPimpl = (AnalyserEquationAstImpl *)*plVar3;
    }
    uStack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
    *plVar3 = (long)pAVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_148.mPimpl);
    if (local_148.mPimpl != (AnalyserEquationAstImpl *)local_138) {
      operator_delete(local_148.mPimpl,local_138._0_8_ + 1);
    }
    if ((size_type *)local_138._16_8_ != psVar6) {
      operator_delete((void *)local_138._16_8_,local_138._32_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._64_8_ != &local_e8) {
      operator_delete((void *)local_138._64_8_,(ulong)(local_e8._M_allocated_capacity + 1));
    }
    if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._56_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._56_8_);
    }
    if (local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.
                 super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Analyser::AnalyserImpl::expression(const AnalyserEquationAstPtr &ast,
                                               bool includeHierarchy)
{
    // Return the generated code for the given AST, specifying the equation and
    // component in which it is, if needed and requested.

    std::string res = "'" + Generator::equationCode(ast, mGeneratorProfile) + "'";

    if (includeHierarchy) {
        auto equationAst = ast;
        auto equationAstParent = ast->parent();
        auto equationAstGrandparent = (equationAstParent != nullptr) ? equationAstParent->parent() : nullptr;

        while (equationAstParent != nullptr) {
            equationAst = equationAstParent;
            equationAstParent = equationAstGrandparent;
            equationAstGrandparent = (equationAstParent != nullptr) ? equationAstParent->parent() : nullptr;

            res += std::string(" in")
                   + ((equationAstParent == nullptr) ? " equation" : "")
                   + " '" + Generator::equationCode(equationAst, mGeneratorProfile) + "'";
        }

        res += " in component '" + componentName(equationAst) + "'";
    }

    return res;
}